

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_dform39(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  DisasContext_conflict10 *ctx_local;
  
  uVar1 = ctx->opcode & 3;
  if (uVar1 == 0) {
    if ((ctx->insns_flags2 & 0x20) != 0) {
      gen_lfdp(ctx);
      return;
    }
  }
  else if (uVar1 == 2) {
    if ((ctx->insns_flags2 & 0x80000) != 0) {
      gen_lxsd(ctx);
      return;
    }
  }
  else if ((uVar1 == 3) && ((ctx->insns_flags2 & 0x80000) != 0)) {
    gen_lxssp(ctx);
    return;
  }
  gen_invalid(ctx);
  return;
}

Assistant:

static void gen_dform39(DisasContext *ctx)
{
    switch (ctx->opcode & 0x3) {
    case 0: /* lfdp */
        if (ctx->insns_flags2 & PPC2_ISA205) {
            return gen_lfdp(ctx);
        }
        break;
    case 2: /* lxsd */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxsd(ctx);
        }
        break;
    case 3: /* lxssp */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxssp(ctx);
        }
        break;
    }
    return gen_invalid(ctx);
}